

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O3

void __thiscall
Validator_resetMultipleMathMLInTestValue_Test::~Validator_resetMultipleMathMLInTestValue_Test
          (Validator_resetMultipleMathMLInTestValue_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Validator, resetMultipleMathMLInTestValue)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::ResetPtr r = libcellml::Reset::create();

    // Multiple MathML blocks in test_value
    r->setVariable(v1);
    r->setTestVariable(v2);
    r->setOrder(6);
    r->setResetValue(NON_EMPTY_MATH);
    r->setTestValue(NON_EMPTY_MATH + NON_EMPTY_MATH);

    c->setName("comp");
    v1->setName("var");
    v1->setUnits("second");
    v2->setName("var2");
    v2->setUnits("second");

    c->addVariable(v1);
    c->addVariable(v2);

    c->addReset(r);

    m->setName("main");
    m->addComponent(c);

    libcellml::ValidatorPtr validator = libcellml::Validator::create();
    validator->validateModel(m);
    EXPECT_EQ(size_t(0), validator->errorCount());
}